

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O2

char ** __thiscall llbuild::basic::POSIXEnvironment::getEnvp(POSIXEnvironment *this)

{
  pointer ppcVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  pointer pbVar3;
  char *local_28;
  
  this->isFrozen = true;
  ppcVar1 = (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  pbVar2 = (this->envStorage).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->envStorage).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    local_28 = (pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)this,&local_28);
  }
  local_28 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<decltype(nullptr)>
            ((vector<char_const*,std::allocator<char_const*>> *)this,&local_28);
  return (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

const char* const* getEnvp() {
    isFrozen = true;

    // Form the final environment.
    env.clear();
    for (const auto& entry : envStorage) {
      env.emplace_back(entry.c_str());
    }
    env.emplace_back(nullptr);
    return env.data();
  }